

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

bool __thiscall
testing::internal::
OnCallSpec<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>::Matches
          (OnCallSpec<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>
           *this,ArgumentTuple *args)

{
  bool bVar1;
  DummyMatchResultListener dummy;
  MatchResultListener local_28;
  
  local_28.stream_ = (ostream *)0x0;
  local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_0031e0e8;
  bVar1 = MatcherBase<solitaire::piles::PileId>::MatchAndExplain
                    ((MatcherBase<solitaire::piles::PileId> *)(this + 0x10),(PileId *)args,&local_28
                    );
  if (bVar1) {
    local_28.stream_ = (ostream *)0x0;
    local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_0031e0e8;
    bVar1 = MatcherBase<const_std::tuple<solitaire::piles::PileId>_&>::MatchAndExplain
                      ((MatcherBase<const_std::tuple<solitaire::piles::PileId>_&> *)(this + 0x28),
                       args,&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }